

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

bool __thiscall helics::TimeCoordinator::addDependency(TimeCoordinator *this,GlobalFederateId fedID)

{
  bool bVar1;
  value_type local_34;
  handle local_30;
  
  local_34.gid = fedID.gid;
  bVar1 = BaseTimeCoordinator::addDependency(&this->super_BaseTimeCoordinator,fedID);
  if (bVar1) {
    gmlc::libguarded::
    shared_guarded<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
    ::lock(&local_30,&this->dependency_federates);
    std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::push_back
              (local_30.data,&local_34);
    std::unique_lock<std::mutex>::~unique_lock(&local_30.m_handle_lock);
  }
  return bVar1;
}

Assistant:

bool TimeCoordinator::addDependency(GlobalFederateId fedID)
{
    if (BaseTimeCoordinator::addDependency(fedID)) {
        dependency_federates.lock()->push_back(fedID);
        return true;
    }
    return false;
}